

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggreports.cpp
# Opt level: O0

void __thiscall aggreports::LoadPeriodsToWeighting(aggreports *this)

{
  char *pcVar1;
  mapped_type_conflict mVar2;
  size_t sVar3;
  mapped_type_conflict *pmVar4;
  size_type sVar5;
  allocator local_121;
  string local_120 [39];
  allocator local_f9;
  string local_f8 [39];
  allocator local_d1;
  string local_d0 [39];
  allocator local_a9;
  string local_a8 [39];
  allocator local_81;
  string local_80 [55];
  allocator local_49;
  string local_48 [36];
  key_type local_24;
  undefined1 auStack_20 [4];
  Periods p;
  FILE *fin;
  aggreports *this_local;
  
  p.weighting = (double)fopen("input/periods.bin","rb");
  if ((FILE *)p.weighting != (FILE *)0x0) {
    while (sVar3 = fread(&local_24,0xc,1,(FILE *)p.weighting), mVar2 = _auStack_20, sVar3 != 0) {
      pmVar4 = std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
               ::operator[](&this->periodstoweighting_,&local_24);
      *pmVar4 = mVar2;
    }
    if (((this->outputFlags_[3] & 1U) == 1) || ((this->outputFlags_[7] & 1U) == 1)) {
      sVar5 = std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
              ::size(&this->periodstoweighting_);
      if ((sVar5 == 0) || ((this->useReturnPeriodFile_ & 1U) != 0)) {
        sVar5 = std::
                map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>::
                size(&this->periodstoweighting_);
        if ((sVar5 != 0) && ((this->ordFlag_ & 1U) == 1)) {
          pcVar1 = this->progname_;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_f8,pcVar1,&local_f9);
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_120,"INFO",&local_121);
          logprintf((string *)local_f8,(string *)local_120,
                    "Tail Value at Risk for Wheatsheaf mean/per sample mean is not supported if you wish to use non-uniform period weights..\n"
                   );
          std::__cxx11::string::~string(local_120);
          std::allocator<char>::~allocator((allocator<char> *)&local_121);
          std::__cxx11::string::~string(local_f8);
          std::allocator<char>::~allocator((allocator<char> *)&local_f9);
        }
      }
      else {
        pcVar1 = this->progname_;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_48,pcVar1,&local_49);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_80,"WARNING",&local_81);
        logprintf((string *)local_48,(string *)local_80,
                  "Return periods file must be present if you wish to use non-uniform period weights for Wheatsheaf mean/per sample mean output.\n"
                 );
        std::__cxx11::string::~string(local_80);
        std::allocator<char>::~allocator((allocator<char> *)&local_81);
        std::__cxx11::string::~string(local_48);
        std::allocator<char>::~allocator((allocator<char> *)&local_49);
        pcVar1 = this->progname_;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_a8,pcVar1,&local_a9);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_d0,"INFO",&local_d1);
        logprintf((string *)local_a8,(string *)local_d0,
                  "Wheatsheaf mean/per sample mean output will not be produced.\n");
        std::__cxx11::string::~string(local_d0);
        std::allocator<char>::~allocator((allocator<char> *)&local_d1);
        std::__cxx11::string::~string(local_a8);
        std::allocator<char>::~allocator((allocator<char> *)&local_a9);
        this->outputFlags_[3] = false;
        this->outputFlags_[7] = false;
      }
    }
  }
  return;
}

Assistant:

void aggreports::LoadPeriodsToWeighting() {

  FILE *fin = fopen(PERIODS_FILE, "rb");
  if (fin == nullptr) return;

  Periods p;
  while (fread(&p, sizeof(Periods), 1, fin) != 0) {
    periodstoweighting_[p.period_no] = p.weighting;
  }

  // User must define return periods if he/she wishes to use non-uniform period
  // weights for Wheatsheaf/per sample mean output
  if (outputFlags_[AGG_WHEATSHEAF_MEAN] == true ||
      outputFlags_[OCC_WHEATSHEAF_MEAN] == true) {
    if (periodstoweighting_.size() > 0 && useReturnPeriodFile_ == false) {
      logprintf(progname_, "WARNING", "Return periods file must be present if "
				      "you wish to use non-uniform period "
				      "weights for Wheatsheaf mean/per sample "
				      "mean output.\n");
      logprintf(progname_, "INFO", "Wheatsheaf mean/per sample mean output "
				   "will not be produced.\n");
      outputFlags_[AGG_WHEATSHEAF_MEAN] = false;
      outputFlags_[OCC_WHEATSHEAF_MEAN] = false;
    } else if (periodstoweighting_.size() > 0 && ordFlag_ == true) {
      logprintf(progname_, "INFO", "Tail Value at Risk for Wheatsheaf mean/per "
				   "sample mean is not supported if you wish "
				   "to use non-uniform period weights..\n");
    }
  }

}